

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::internal::PrintfFormatter<char>::parse_flags
          (PrintfFormatter<char> *this,FormatSpec *spec,char **s)

{
  char *pcVar1;
  char **s_local;
  FormatSpec *spec_local;
  PrintfFormatter<char> *this_local;
  
  do {
    pcVar1 = *s;
    *s = pcVar1 + 1;
    switch(*pcVar1) {
    case ' ':
      spec->flags_ = spec->flags_ | 1;
      break;
    default:
      *s = *s + -1;
      return;
    case '#':
      spec->flags_ = spec->flags_ | 8;
      break;
    case '+':
      spec->flags_ = spec->flags_ | 3;
      break;
    case '-':
      (spec->super_AlignSpec).align_ = ALIGN_LEFT;
      break;
    case '0':
      (spec->super_AlignSpec).super_WidthSpec.fill_ = L'0';
    }
  } while( true );
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::parse_flags(
    FormatSpec &spec, const Char *&s) {
  for (;;) {
    switch (*s++) {
      case '-':
        spec.align_ = ALIGN_LEFT;
        break;
      case '+':
        spec.flags_ |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '0':
        spec.fill_ = '0';
        break;
      case ' ':
        spec.flags_ |= SIGN_FLAG;
        break;
      case '#':
        spec.flags_ |= HASH_FLAG;
        break;
      default:
        --s;
        return;
    }
  }
}